

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O2

int main(void)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *__ptr;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  SUNContext sunctx;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined8 local_98;
  SUNProfiler profobj;
  long nst;
  undefined8 local_80;
  sunrealtype t;
  long ncfn;
  long nni;
  long netf;
  long nsetups;
  long nfe;
  long nst_1;
  long nfeLS;
  long nje;
  
  sunctx = (SUNContext)0x0;
  iVar2 = SUNContext_Create(0);
  iVar3 = check_retval(iVar2,"SUNContext_Create");
  iVar2 = 1;
  if (iVar3 == 0) {
    SUNContext_PopErrHandler(sunctx);
    SUNContext_PushErrHandler(sunctx,SUNAbortErrHandlerFn,0);
    SUNContext_PushErrHandler(sunctx,SUNLogErrHandlerFn,0);
    iVar3 = SUNContext_GetProfiler(sunctx,&profobj);
    iVar3 = check_retval(iVar3,"SUNContext_GetProfiler");
    if (iVar3 == 0) {
      uVar4 = N_VNew_Serial(0x32,sunctx);
      iVar3 = SUNContext_GetLastError(sunctx);
      iVar3 = check_retval(iVar3,"N_VNew_Serial");
      if (iVar3 == 0) {
        __ptr = (undefined8 *)malloc(0x30);
        if (__ptr == (undefined8 *)0x0) {
          fwrite("MEMORY_ERROR: malloc failed - returned NULL pointer\n",0x34,1,_stderr);
        }
        else {
          *__ptr = 0x3fc745d1745d1746;
          __ptr[1] = 0x3fc5555555555555;
          *(undefined4 *)(__ptr + 2) = 0;
          *(undefined4 *)((long)__ptr + 0x14) = 0x403e4000;
          *(undefined4 *)(__ptr + 3) = 0;
          *(undefined4 *)((long)__ptr + 0x1c) = 0x3ff60000;
          __ptr[4] = 0x4042000000000000;
          __ptr[5] = profobj;
          local_98 = uVar4;
          lVar5 = N_VGetArrayPointer(uVar4);
          for (lVar8 = 1; lVar8 != 6; lVar8 = lVar8 + 1) {
            local_a0 = (double)(int)lVar8 * 0.16666666666666666;
            local_a8 = 1.0 - local_a0;
            iVar2 = 1;
            for (lVar9 = -400; lVar9 != 0; lVar9 = lVar9 + 0x28) {
              dVar1 = (double)iVar2 * 0.18181818181818182;
              local_b0 = (2.0 - dVar1) * dVar1 * local_a0 * local_a8;
              dVar1 = exp(dVar1 * 5.0 * local_a0);
              *(double *)(lVar5 + 400 + lVar9) = dVar1 * local_b0;
              iVar2 = iVar2 + 1;
            }
            lVar5 = lVar5 + 8;
          }
          uVar6 = CVodeCreate(2,sunctx);
          local_80 = uVar6;
          iVar2 = SUNContext_GetLastError(sunctx);
          iVar3 = check_retval(iVar2,"CVodeCreate");
          uVar4 = local_98;
          iVar2 = 1;
          if (iVar3 == 0) {
            iVar3 = CVodeInit(0,uVar6,f,local_98);
            iVar3 = check_retval(iVar3,"CVodeInit");
            if (iVar3 == 0) {
              iVar3 = CVodeSStolerances(0,0x3ee4f8b588e368f1,uVar6);
              iVar3 = check_retval(iVar3,"CVodeSStolerances");
              if (iVar3 == 0) {
                iVar3 = CVodeSetUserData(uVar6,__ptr);
                iVar3 = check_retval(iVar3,"CVodeSetUserData");
                if (iVar3 == 0) {
                  uVar7 = SUNBandMatrix(0x32,5,5,sunctx);
                  iVar3 = SUNContext_GetLastError(sunctx);
                  iVar3 = check_retval(iVar3,"SUNBandMatrix");
                  if (iVar3 == 0) {
                    uVar4 = SUNLinSol_Band(uVar4,uVar7,sunctx);
                    iVar3 = SUNContext_GetLastError(sunctx);
                    iVar3 = check_retval(iVar3,"SUNLinSol_Band");
                    if (iVar3 == 0) {
                      iVar3 = CVodeSetLinearSolver(uVar6,uVar4,uVar7);
                      iVar3 = check_retval(iVar3,"CVodeSetLinearSolver");
                      if (iVar3 == 0) {
                        local_a8 = (double)uVar4;
                        iVar3 = CVodeSetJacFn(uVar6,Jac);
                        iVar3 = check_retval(iVar3,"CVodeSetJacFn");
                        uVar4 = local_98;
                        if (iVar3 == 0) {
                          local_b0 = (double)N_VMaxNorm(local_98);
                          puts("\n2-D Advection-Diffusion Equation");
                          iVar2 = 10;
                          printf("Mesh dimensions = %d X %d\n",10,5);
                          printf("Total system size = %d\n",0x32);
                          printf("Tolerance parameters: reltol = %g   abstol = %g\n\n",0,
                                 0x3ee4f8b588e368f1);
                          printf("At t = %g      max.norm(u) =%14.6e \n",0,local_b0);
                          local_b0 = 0.1;
                          while( true ) {
                            bVar10 = iVar2 == 0;
                            iVar2 = iVar2 + -1;
                            if (bVar10) break;
                            iVar3 = CVode(SUB84(local_b0,0),uVar6,uVar4,&t,1);
                            iVar3 = check_retval(iVar3,"CVode");
                            if (iVar3 != 0) break;
                            local_a0 = (double)N_VMaxNorm(uVar4);
                            iVar3 = CVodeGetNumSteps(uVar6,&nst);
                            check_retval(iVar3,"CVodeGetNumSteps");
                            printf("At t = %4.2f   max.norm(u) =%14.6e   nst = %4ld\n",SUB84(t,0),
                                   local_a0,nst);
                            local_b0 = local_b0 + 0.1;
                          }
                          iVar2 = CVodeGetNumSteps(uVar6,&nst_1);
                          check_retval(iVar2,"CVodeGetNumSteps");
                          iVar2 = CVodeGetNumRhsEvals(uVar6,&nfe);
                          check_retval(iVar2,"CVodeGetNumRhsEvals");
                          iVar2 = CVodeGetNumLinSolvSetups(uVar6,&nsetups);
                          check_retval(iVar2,"CVodeGetNumLinSolvSetups");
                          iVar2 = CVodeGetNumErrTestFails(uVar6,&netf);
                          check_retval(iVar2,"CVodeGetNumErrTestFails");
                          iVar2 = CVodeGetNumNonlinSolvIters(uVar6,&nni);
                          check_retval(iVar2,"CVodeGetNumNonlinSolvIters");
                          iVar2 = CVodeGetNumNonlinSolvConvFails(uVar6,&ncfn);
                          check_retval(iVar2,"CVodeGetNumNonlinSolvConvFails");
                          iVar2 = CVodeGetNumJacEvals(uVar6,&nje);
                          check_retval(iVar2,"CVodeGetNumJacEvals");
                          iVar2 = CVodeGetNumLinRhsEvals(uVar6,&nfeLS);
                          check_retval(iVar2,"CVodeGetNumLinRhsEvals");
                          puts("\nFinal Statistics:");
                          iVar2 = 0;
                          printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n"
                                 ,nst_1,nfe,nsetups,nfeLS,nje);
                          printf("nni = %-6ld ncfn = %-6ld netf = %ld\n",nni,ncfn,netf);
                          N_VDestroy(uVar4);
                          CVodeFree(&local_80);
                          SUNLinSolFree(local_a8);
                          SUNMatDestroy(uVar7);
                          free(__ptr);
                          SUNContext_Free(&sunctx);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
  sunrealtype dx, dy, reltol, abstol, t, tout, umax;
  N_Vector u;
  UserData data;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;
  long int nst;
  SUNContext sunctx;
  SUNProfiler profobj;

  /* Initialize variables */
  u         = NULL;
  data      = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  sunctx    = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(retval, "SUNContext_Create")) { return (1); }

  /* Setup different error handler stack so that we abort after logging */
  SUNContext_PopErrHandler(sunctx);
  SUNContext_PushErrHandler(sunctx, SUNAbortErrHandlerFn, NULL);
  SUNContext_PushErrHandler(sunctx, SUNLogErrHandlerFn, NULL);

  /* Get a reference to the profiler */
  retval = SUNContext_GetProfiler(sunctx, &profobj);
  if (check_retval(retval, "SUNContext_GetProfiler")) { return (1); }

  SUNDIALS_MARK_FUNCTION_BEGIN(profobj);

  /* Create a serial vector */

  u = N_VNew_Serial(NEQ, sunctx); /* Allocate u vector */
  if (check_retval(SUNContext_GetLastError(sunctx), "N_VNew_Serial"))
  {
    return (1);
  }

  reltol = ZERO; /* Set the tolerances */
  abstol = ATOL;

  data = (UserData)malloc(sizeof *data); /* Allocate data memory */
  if (!data)
  {
    fprintf(stderr, "MEMORY_ERROR: malloc failed - returned NULL pointer\n");
    return 1;
  }

  dx = data->dx = XMAX / (MX + 1); /* Set grid coefficients in data */
  dy = data->dy = YMAX / (MY + 1);
  data->hdcoef  = ONE / (dx * dx);
  data->hacoef  = HALF / (TWO * dx);
  data->vdcoef  = ONE / (dy * dy);
  data->profobj = profobj;

  SUNDIALS_MARK_BEGIN(profobj, "Setup");

  SetIC(u, data); /* Initialize u vector */

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "CVodeCreate"))
  {
    return (1);
  }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the inital time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(retval, "CVodeInit")) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerance */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(retval, "CVodeSStolerances")) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(retval, "CVodeSetUserData")) { return (1); }

  /* Create banded SUNMatrix for use in linear solves -- since this will be factored,
     set the storage bandwidth to be the sum of upper and lower bandwidths */
  A = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "SUNBandMatrix"))
  {
    return (1);
  }

  /* Create banded SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Band(u, A, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "SUNLinSol_Band"))
  {
    return (1);
  }

  /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(retval, "CVodeSetLinearSolver")) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(retval, "CVodeSetJacFn")) { return (1); }

  SUNDIALS_MARK_END(profobj, "Setup");

  /* In loop over output points: call CVode, print results, test for errors */

  SUNDIALS_MARK_BEGIN(profobj, "Integration loop");
  umax = N_VMaxNorm(u);
  PrintHeader(reltol, abstol, umax);
  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout += DTOUT)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    if (check_retval(retval, "CVode")) { break; }
    umax   = N_VMaxNorm(u);
    retval = CVodeGetNumSteps(cvode_mem, &nst);
    check_retval(retval, "CVodeGetNumSteps");
    PrintOutput(t, umax, nst);
  }
  SUNDIALS_MARK_END(profobj, "Integration loop");
  PrintFinalStats(cvode_mem); /* Print some final statistics   */

  N_VDestroy(u);         /* Free the u vector          */
  CVodeFree(&cvode_mem); /* Free the integrator memory */
  SUNLinSolFree(LS);     /* Free linear solver memory  */
  SUNMatDestroy(A);      /* Free the matrix memory     */
  free(data);            /* Free the user data         */

  SUNDIALS_MARK_FUNCTION_END(profobj);
  SUNContext_Free(&sunctx);
  return (0);
}